

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitTryTable(InternalAnalyzer *this,TryTable *curr)

{
  bool bVar1;
  Name *pNVar2;
  undefined1 local_50 [8];
  Name name;
  Iterator __end2;
  Iterator __begin2;
  ArenaVector<wasm::Name> *__range2;
  TryTable *curr_local;
  InternalAnalyzer *this_local;
  
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::begin
                 ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(curr + 0x38));
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::end
                 ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(curr + 0x38));
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator!=
                      ((Iterator *)&__end2.index,(Iterator *)&name.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                       ((Iterator *)&__end2.index);
    local_50 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
              (&this->parent->breakTargets,(value_type *)local_50);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
      for (auto name : curr->catchDests) {
        parent.breakTargets.insert(name);
      }
    }